

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDsdGlobal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  int iVar1;
  DdManager *dd;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  int *piVar6;
  void *pvVar7;
  undefined8 uVar8;
  ulong uVar9;
  Dsd_Manager_t *pDsdMan;
  Abc_Ntk_t *pNtk_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar10;
  Dsd_Node_t *pDVar11;
  Dsd_Node_t **__ptr;
  char **pInputNames;
  char **pOutputNames;
  Abc_Ntk_t *pAVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  char *__assertion;
  int iVar16;
  int local_4c;
  ulong local_48;
  DdManager *local_40;
  Vec_Ptr_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkDsdGlobal(Abc_Ntk_t *, int, int, int)");
  }
  local_40 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (local_40 != (DdManager *)0x0) {
    if (fVerbose != 0) {
      uVar3 = Cudd_ReadKeys(local_40);
      uVar4 = Cudd_ReadDead(local_40);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar3 - uVar4));
    }
    p = Vec_PtrAlloc(pNtk->vCos->nSize);
    local_38 = p;
    for (uVar15 = 0; (int)uVar15 < pNtk->vCos->nSize; uVar15 = (ulong)((int)uVar15 + 1)) {
      pAVar5 = Abc_NtkCo(pNtk,(int)uVar15);
      piVar6 = (int *)Abc_NtkGlobalBdd(pAVar5->pNtk);
      pvVar7 = *(void **)(piVar6 + 2);
      if (pvVar7 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar16 = pAVar5->Id;
      lVar13 = (long)iVar16;
      iVar1 = *piVar6;
      if (iVar1 <= iVar16) {
        iVar14 = iVar16 + 10;
        if (iVar16 < iVar1 * 2) {
          iVar14 = iVar1 * 2;
        }
        local_48 = uVar15;
        if (iVar1 < iVar14) {
          pvVar7 = realloc(pvVar7,(long)iVar14 * 8);
          p = local_38;
          *(void **)(piVar6 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,((long)iVar14 - (long)*piVar6) * 8);
          *piVar6 = iVar14;
          uVar15 = local_48;
        }
      }
      uVar9 = *(ulong *)((long)pvVar7 + lVar13 * 8);
      if (uVar9 == 0) {
        if (*(code **)(piVar6 + 8) == (code *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar8 = (**(code **)(piVar6 + 8))(*(undefined8 *)(piVar6 + 4));
          *(undefined8 *)(*(long *)(piVar6 + 2) + lVar13 * 8) = uVar8;
          uVar9 = *(ulong *)(*(long *)(piVar6 + 2) + lVar13 * 8);
        }
      }
      Vec_PtrPush(p,(void *)(*(uint *)&pAVar5->field_0x14 >> 10 & 1 ^ uVar9));
    }
    pvVar7 = Abc_NtkGlobalBdd(pNtk);
    dd = *(DdManager **)((long)pvVar7 + 0x10);
    pDsdMan = Dsd_ManagerStart(dd,pNtk->vCis->nSize,fVerbose);
    if (pDsdMan == (Dsd_Manager_t *)0x0) {
      Vec_PtrFree(p);
      Cudd_Quit(dd);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    else {
      Dsd_Decompose(pDsdMan,(DdNode **)p->pArray,pNtk->vCos->nSize);
      Vec_PtrFree(p);
      Abc_NtkFreeGlobalBdds(pNtk,0);
      pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
      Cudd_bddIthVar((DdManager *)pNtk_00->pManFunc,dd->size + -1);
      aVar10.pCopy = Abc_NtkCreateNodeConst1(pNtk_00);
      pAVar5 = Abc_AigConst1(pNtk);
      pAVar5->field_6 = aVar10;
      pDVar11 = Dsd_ManagerReadConst1(pDsdMan);
      Dsd_NodeSetMark(pDVar11,aVar10.iTemp);
      for (iVar16 = 0; iVar16 < pNtk->vCis->nSize; iVar16 = iVar16 + 1) {
        pAVar5 = Abc_NtkCi(pNtk,iVar16);
        pDVar11 = Dsd_ManagerReadInput(pDsdMan,iVar16);
        Dsd_NodeSetMark(pDVar11,(pAVar5->field_6).iTemp);
      }
      __ptr = Dsd_TreeCollectNodesDfs(pDsdMan,&local_4c);
      for (lVar13 = 0; lVar13 < local_4c; lVar13 = lVar13 + 1) {
        Abc_NtkDsdConstructNode(pDsdMan,__ptr[lVar13],pNtk_00,(int *)0x0);
      }
      free(__ptr);
      for (iVar16 = 0; iVar16 < pNtk->vCos->nSize; iVar16 = iVar16 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar16);
        puVar2 = (undefined8 *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
        if ((*(uint *)((long)puVar2 + 0x14) & 0xf) == 7) {
          if (((ulong)puVar2 & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002756eb:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                          ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
          }
          if (*(int *)*puVar2 != 3) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_002756eb;
          }
          if (*(int *)((long)puVar2 + 0x1c) == 2) {
            pDVar11 = Dsd_ManagerReadRoot(pDsdMan,iVar16);
            uVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe));
            if ((uVar3 & 1) != 0) {
              __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                            ,0xc9,
                            "void Abc_NtkDsdConstruct(Dsd_Manager_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
            }
            puVar2[8] = (ulong)((uint)pDVar11 & 1) | (long)(int)uVar3;
          }
        }
      }
      Abc_NtkFinalize(pNtk,pNtk_00);
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      if (fPrint != 0) {
        pInputNames = Abc_NtkCollectCioNames(pNtk,0);
        pOutputNames = Abc_NtkCollectCioNames(pNtk,1);
        if (fVerbose == 0) {
          Dsd_TreePrint2(_stdout,pDsdMan,pInputNames,pOutputNames,-1);
        }
        else {
          Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,fShort,-1);
        }
        free(pInputNames);
        free(pOutputNames);
      }
      Dsd_ManagerStop(pDsdMan);
    }
    Extra_StopManager(local_40);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar12 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar12;
      }
      iVar16 = Abc_NtkCheck(pNtk_00);
      if (iVar16 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkDsdGlobal: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    DdManager * dd;
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return NULL;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    // transform the result of mapping into a BDD network
    pNtkNew = Abc_NtkDsdInternal( pNtk, fVerbose, fPrint, fShort );
    Extra_StopManager( dd );
    if ( pNtkNew == NULL )
        return NULL;
    // copy EXDC network
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkDsdGlobal: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}